

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

VP8StatusCode GetFeatures(uint8_t *data,size_t data_size,WebPBitstreamFeatures *features)

{
  long in_RDX;
  long in_RDI;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int *in_stack_00000050;
  int *in_stack_00000058;
  size_t in_stack_00000060;
  uint8_t *in_stack_00000068;
  int *in_stack_00000080;
  WebPHeaderStructure *in_stack_00000088;
  undefined4 local_4;
  
  if ((in_RDX == 0) || (in_RDI == 0)) {
    local_4 = VP8_STATUS_INVALID_PARAM;
  }
  else {
    DefaultFeatures((WebPBitstreamFeatures *)0x1169a7);
    local_4 = ParseHeadersInternal
                        (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                         in_stack_00000048,in_stack_00000040,in_stack_00000080,in_stack_00000088);
  }
  return local_4;
}

Assistant:

static VP8StatusCode GetFeatures(const uint8_t* const data, size_t data_size,
                                 WebPBitstreamFeatures* const features) {
  if (features == NULL || data == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  DefaultFeatures(features);

  // Only parse enough of the data to retrieve the features.
  return ParseHeadersInternal(data, data_size,
                              &features->width, &features->height,
                              &features->has_alpha, &features->has_animation,
                              &features->format, NULL);
}